

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,long right,ValidityMask *mask,
                   idx_t idx)

{
  bool bVar1;
  OutOfRangeException *this;
  idx_t len;
  uint uVar2;
  char *__dest;
  ulong left_00;
  void *__src;
  allocator local_61;
  idx_t copy_size;
  string_t result_str;
  undefined8 local_38;
  void *local_30;
  
  local_30 = left.value._8_8_;
  local_38 = left.value._0_8_;
  uVar2 = left.value._0_4_;
  __src = local_30;
  if (uVar2 < 0xd) {
    __src = (void *)((long)&local_38 + 4);
  }
  if (right < 1) {
    right = 0;
  }
  left_00 = (ulong)uVar2;
  if (uVar2 == 0) {
    right = 0;
  }
  bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left_00,right,&copy_size);
  if (bVar1) {
    result_str = StringVector::EmptyString((StringVector *)fun.result,(Vector *)copy_size,len);
    __dest = result_str.value._8_8_;
    if (result_str.value._0_4_ < 0xd) {
      __dest = result_str.value.pointer.prefix;
    }
    while (bVar1 = right != 0, right = right - 1, bVar1) {
      switchD_00916250::default(__dest,__src,left_00);
      __dest = __dest + left_00;
    }
    string_t::Finalize(&result_str);
    return (string_t)result_str.value;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&result_str,
             "Cannot create a string of size: \'%d\' * \'%d\', the maximum supported string size is: \'%d\'"
             ,&local_61);
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
            (this,(string *)&result_str,left_00,right,0xffffffff);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}